

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O0

string * cm_archive_error_string_abi_cxx11_(string *__return_storage_ptr__,archive *a)

{
  char *local_50;
  allocator<char> local_21;
  char *local_20;
  char *e;
  archive *a_local;
  
  e = (char *)a;
  a_local = (archive *)__return_storage_ptr__;
  local_20 = archive_error_string(a);
  local_50 = local_20;
  if (local_20 == (char *)0x0) {
    local_50 = "unknown error";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_50,&local_21);
  std::allocator<char>::~allocator(&local_21);
  return __return_storage_ptr__;
}

Assistant:

static std::string cm_archive_error_string(struct archive* a)
{
  const char* e = archive_error_string(a);
  return e ? e : "unknown error";
}